

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

bool __thiscall
iutest::detail::IParamTestSuiteInfo::is_same
          (IParamTestSuiteInfo *this,string *base_name,string *package_name)

{
  __type_conflict _Var1;
  __type_conflict local_21;
  string *package_name_local;
  string *base_name_local;
  IParamTestSuiteInfo *this_local;
  
  _Var1 = std::operator==(&this->m_testsuite_base_name,base_name);
  local_21 = false;
  if (_Var1) {
    local_21 = std::operator==(&this->m_package_name,package_name);
  }
  return local_21;
}

Assistant:

bool is_same(const ::std::string& base_name, const ::std::string& package_name)
    {
        return m_testsuite_base_name == base_name && m_package_name == package_name;
    }